

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O0

void __thiscall cmExportSet::~cmExportSet(cmExportSet *this)

{
  cmExportSet *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~map(&this->PackageDependencies);
  std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>::
  ~vector(&this->Installations);
  std::__cxx11::string::~string((string *)&this->Name);
  std::
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  ::~vector(&this->TargetExports);
  return;
}

Assistant:

cmExportSet::~cmExportSet() = default;